

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeString::extractBetween
          (UnicodeString *this,int32_t start,int32_t limit,UnicodeString *target)

{
  UnicodeString *target_local;
  int32_t limit_local;
  int32_t start_local;
  UnicodeString *this_local;
  
  target_local._0_4_ = limit;
  target_local._4_4_ = start;
  _limit_local = this;
  pinIndex(this,(int32_t *)((long)&target_local + 4));
  pinIndex(this,(int32_t *)&target_local);
  doExtract(this,target_local._4_4_,(int32_t)target_local - target_local._4_4_,target);
  return;
}

Assistant:

void 
UnicodeString::extractBetween(int32_t start,
                  int32_t limit,
                  UnicodeString& target) const {
  pinIndex(start);
  pinIndex(limit);
  doExtract(start, limit - start, target);
}